

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindDecimalModulo<duckdb::ModuloOperator>
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  bool bVar1;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *__x;
  long in_RDX;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  LogicalType *result_type;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_00000068;
  ScalarFunction *in_stack_00000070;
  ClientContext *in_stack_00000078;
  LogicalType *arg;
  iterator __end3;
  iterator __begin3;
  vector<duckdb::LogicalType,_true> *__range3;
  unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
  bind_data;
  LogicalType *in_stack_ffffffffffffff28;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_ffffffffffffff50;
  PhysicalType in_stack_ffffffffffffff8f;
  __normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  local_48;
  long local_40;
  long local_18;
  
  this._M_head_impl =
       (FunctionData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  local_18 = in_RDX;
  BindDecimalArithmetic<true>(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  __x = (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
        unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
        ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                      *)this._M_head_impl);
  if (((__x->super__Function_base)._M_functor._M_pod_data[8] & 1U) != 0) {
    local_40 = local_18 + 0x48;
    local_48._M_current =
         (LogicalType *)
         ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                   (in_stack_ffffffffffffff28);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               in_stack_ffffffffffffff28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                          *)this._M_head_impl,
                         (__normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                          *)in_stack_ffffffffffffff28);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
      ::operator*(&local_48);
      LogicalType::LogicalType
                ((LogicalType *)in_stack_ffffffffffffff50,(LogicalTypeId)((ulong)__x >> 0x38));
      LogicalType::operator=((LogicalType *)this._M_head_impl,in_stack_ffffffffffffff28);
      LogicalType::~LogicalType((LogicalType *)0x12602c9);
      __gnu_cxx::
      __normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
      ::operator++(&local_48);
    }
    LogicalType::LogicalType
              ((LogicalType *)in_stack_ffffffffffffff50,(LogicalTypeId)((ulong)__x >> 0x38));
    LogicalType::operator=((LogicalType *)this._M_head_impl,in_stack_ffffffffffffff28);
    LogicalType::~LogicalType((LogicalType *)0x1260332);
  }
  LogicalType::InternalType((LogicalType *)(local_18 + 0x90));
  GetBinaryFunctionIgnoreZero<duckdb::ModuloOperator>(in_stack_ffffffffffffff8f);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  operator=(in_stack_ffffffffffffff50,__x);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x1260381);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::DecimalArithmeticBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             this._M_head_impl,
             (unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>_>
              *)in_stack_ffffffffffffff28);
  unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                 *)0x12603a0);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> BindDecimalModulo(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {
	auto bind_data = BindDecimalArithmetic<true>(context, bound_function, arguments);
	// now select the physical function to execute
	if (bind_data->check_overflow) {
		// fallback to DOUBLE if the decimal type is not guaranteed to fit within the max decimal width
		for (auto &arg : bound_function.arguments) {
			arg = LogicalType::DOUBLE;
		}
		bound_function.return_type = LogicalType::DOUBLE;
	}
	auto &result_type = bound_function.return_type;
	bound_function.function = GetBinaryFunctionIgnoreZero<OP>(result_type.InternalType());
	return std::move(bind_data);
}